

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O0

int absl::lts_20250127::str_format_internal::FormatArgImpl::ToIntVal<unsigned_int>(uint *val)

{
  uint uVar1;
  int iVar2;
  uint *val_local;
  
  uVar1 = *val;
  iVar2 = std::numeric_limits<int>::max();
  if ((ulong)(long)iVar2 < (ulong)uVar1) {
    val_local._4_4_ = std::numeric_limits<int>::max();
  }
  else {
    val_local._4_4_ = *val;
  }
  return val_local._4_4_;
}

Assistant:

static int ToIntVal(const T& val) {
    using CommonType = typename std::conditional<std::is_signed<T>::value,
                                                 int64_t, uint64_t>::type;
    if (static_cast<CommonType>(val) >
        static_cast<CommonType>((std::numeric_limits<int>::max)())) {
      return (std::numeric_limits<int>::max)();
    } else if (std::is_signed<T>::value &&
               static_cast<CommonType>(val) <
                   static_cast<CommonType>((std::numeric_limits<int>::min)())) {
      return (std::numeric_limits<int>::min)();
    }
    return static_cast<int>(val);
  }